

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall ON_Viewport::Extents(ON_Viewport *this,double angle,ON_BoundingBox *bbox)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  int z_index;
  uint x_index;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ON_3dVector camY;
  ON_3dVector camX;
  ON_3dVector box_corner;
  ON_3dPoint center;
  double local_100;
  double local_f8;
  double local_f0;
  ON_3dVector local_b8;
  ON_3dVector local_98;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  bVar4 = ON_BoundingBox::IsValid(bbox);
  if (bVar4) {
    x_index = 0;
    iVar5 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this,0);
    if ((char)iVar5 != '\0') {
      local_98.z = (this->m_CamX).z;
      local_98.x = (this->m_CamX).x;
      local_98.y = (this->m_CamX).y;
      local_b8.z = (this->m_CamY).z;
      local_b8.x = (this->m_CamY).x;
      local_b8.y = (this->m_CamY).y;
      ON_BoundingBox::Center(&local_60,bbox);
      local_f8 = 0.0;
      local_f0 = 0.0;
      local_100 = 0.0;
      dVar7 = 0.0;
      for (; x_index != 2; x_index = x_index + 1) {
        for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
          for (z_index = 0; z_index != 2; z_index = z_index + 1) {
            ON_BoundingBox::Corner(&local_48,bbox,x_index,iVar5,z_index);
            ON_3dVector::ON_3dVector(&local_78,&local_48);
            dVar9 = ON_3dVector::operator*(&local_98,&local_78);
            dVar1 = ON_3dVector::operator*(&local_b8,&local_78);
            dVar8 = dVar1;
            dVar2 = dVar1;
            dVar3 = dVar9;
            if ((iVar5 != 0 || x_index != 0) || z_index != 0) {
              dVar2 = dVar9;
              if ((dVar9 <= local_f0) && (dVar2 = local_f0, dVar9 < local_f8)) {
                local_f8 = dVar9;
              }
              local_f0 = dVar2;
              dVar2 = local_100;
              dVar9 = local_f8;
              dVar3 = local_f0;
              if ((dVar1 <= dVar7) && (dVar8 = dVar7, dVar1 < local_100)) {
                dVar2 = dVar1;
              }
            }
            local_f0 = dVar3;
            local_f8 = dVar9;
            local_100 = dVar2;
            dVar7 = dVar8;
          }
        }
      }
      dVar9 = dVar7 - local_100;
      if (dVar7 - local_100 <= local_f0 - local_f8) {
        dVar9 = local_f0 - local_f8;
      }
      if (dVar9 <= 1.490116119385e-08) {
        ON_BoundingBox::Diagonal(&local_78,bbox);
        dVar9 = ON_3dVector::MaximumCoordinate(&local_78);
      }
      uVar6 = -(ulong)(1.490116119385e-08 < dVar9 * 0.5);
      bVar4 = Extents(this,angle,&local_60,
                      (double)(~uVar6 & 0x3ff0000000000000 | (ulong)(dVar9 * 0.5) & uVar6));
      x_index = (uint)bVar4;
    }
  }
  else {
    x_index = 0;
  }
  return SUB41(x_index,0);
}

Assistant:

bool ON_Viewport::Extents( double angle, const ON_BoundingBox& bbox )
{
  double radius;
  double x, y, xmin, xmax, ymin, ymax;
  int i,j,k;

  if ( !bbox.IsValid() || !IsValid() )
    return false;
  ON_3dVector camX = CameraX();
  ON_3dVector camY = CameraY();
  ON_3dPoint center = bbox.Center();
  xmin=xmax=ymin=ymax=0.0;
  for (i=0;i<2;i++) for (j=0;j<2;j++) for (k=0;k<2;k++) {
    ON_3dVector box_corner = bbox.Corner(i,j,k);
    x = camX*box_corner;
    y = camY*box_corner;
    if ( i==0&&j==0&&k==0) {
      xmin=xmax=x;
      ymin=ymax=y;
    }
    else {
      if ( x > xmax) xmax=x; else if (x < xmin) xmin = x;
      if ( y > ymax) ymax=y; else if (y < ymin) ymin = y;
    }
  }
  radius = xmax-xmin;
  if ( ymax-ymin > radius )
    radius = ymax-ymin;
  if ( radius <= ON_SQRT_EPSILON ) {
    radius = bbox.Diagonal().MaximumCoordinate();
  }
  radius *= 0.5;
  if ( radius <= ON_SQRT_EPSILON )
    radius = 1.0;
  return Extents( angle, center, radius );
}